

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printAssociativeContainer<QHash<QString,QVariant>>
          (QtPrivate *this,QDebug debug,char *which,QHash<QString,_QVariant> *c)

{
  long lVar1;
  _func_int **pp_Var2;
  QDebug *pQVar3;
  QVariant *variant;
  long in_FS_OFFSET;
  QDebug local_58;
  piter local_50;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(((debug.stream)->ts)._vptr_QTextStream + 6) = 0;
  pQVar3 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar3,"(");
  local_50 = (piter)QHash<QString,_QVariant>::constBegin(c);
  while ((local_50.d != (Data<QHashPrivate::Node<QString,_QVariant>_> *)0x0 ||
         (local_50.bucket != 0))) {
    pQVar3 = QDebug::operator<<((QDebug *)debug.stream,'(');
    pQVar3 = QDebug::operator<<(pQVar3,(QString *)
                                       ((local_50.d)->spans[local_50.bucket >> 7].entries +
                                       (local_50.d)->spans[local_50.bucket >> 7].offsets
                                       [(uint)local_50.bucket & 0x7f]));
    variant = (QVariant *)QDebug::operator<<(pQVar3,", ");
    ::operator<<(&local_58,variant);
    QDebug::operator<<(&local_58,')');
    QDebug::~QDebug(&local_58);
    QHashPrivate::iterator<QHashPrivate::Node<QString,_QVariant>_>::operator++(&local_50);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  pp_Var2 = ((debug.stream)->ts)._vptr_QTextStream;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)0x0;
  *(_func_int ***)this = pp_Var2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printAssociativeContainer(QDebug debug, const char *which, const AssociativeContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << "(";
    for (typename AssociativeContainer::const_iterator it = c.constBegin();
         it != c.constEnd(); ++it) {
        debug << '(' << it.key() << ", " << it.value() << ')';
    }
    debug << ')';
    return debug;
}